

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  _Alloc_hider _Var2;
  uint uVar3;
  _Node *p_Var4;
  ulong uVar5;
  size_t sVar6;
  ostream *poVar7;
  long *plVar8;
  undefined8 uVar9;
  int i;
  _List_node_base *p_Var10;
  ulong uVar11;
  char *pcVar12;
  int *piVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  string path;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_file_list;
  pointer local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint local_54;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  ulong local_38;
  
  local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50._M_impl._M_node._M_size = 0;
  local_50._M_impl._M_node.super__List_node_base._M_prev =
       local_50._M_impl._M_node.super__List_node_base._M_next;
  if (1 < argc) {
    local_38 = (ulong)(uint)argc;
    uVar11 = 1;
    local_54 = 0;
    do {
      paVar14 = &local_78.field_2;
      pcVar12 = argv[uVar11];
      if (*pcVar12 != '-') {
        std::__cxx11::string::string((string *)&local_78,pcVar12,(allocator *)&local_80);
        p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            &local_50,&local_78);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        local_50._M_impl._M_node._M_size = local_50._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar14) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        goto LAB_00108e67;
      }
      uVar3 = (byte)pcVar12[1] - 99;
      if (0x14 < uVar3) {
switchD_00108891_caseD_6a:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid option: ",0x10);
        pcVar12 = argv[uVar11];
        if (pcVar12 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1171c0);
        }
        else {
          sVar6 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar6);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
switchD_00108891_caseD_68:
        help_mode = true;
        goto LAB_00108e67;
      }
      switch((uint)(byte)pcVar12[1]) {
      case 99:
        local_78._M_dataplus._M_p = (pointer)paVar14;
        sVar6 = strlen(pcVar12 + 2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar12 + 2,pcVar12 + sVar6 + 2);
        _Var2._M_p = local_78._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar1 = *piVar13;
        *piVar13 = 0;
        uVar5 = strtol(_Var2._M_p,&local_80,10);
        if (local_80 != _Var2._M_p) {
          if ((0xfffffffeffffffff < uVar5 - 0x80000000) && (*piVar13 != 0x22)) {
            if (*piVar13 == 0) {
              *piVar13 = iVar1;
            }
            center_bias_level = (int)uVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
              uVar5 = (ulong)(uint)center_bias_level;
            }
LAB_00108d62:
            if ((0x7f < (int)uVar5) || ((int)uVar5 < 0)) goto switchD_00108891_caseD_68;
            break;
          }
          goto LAB_001096ab;
        }
        goto LAB_001096b7;
      case 100:
        local_78._M_dataplus._M_p = (pointer)paVar14;
        sVar6 = strlen(pcVar12 + 2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar12 + 2,pcVar12 + sVar6 + 2);
        _Var2._M_p = local_78._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar1 = *piVar13;
        *piVar13 = 0;
        uVar5 = strtol(_Var2._M_p,&local_80,10);
        if (local_80 != _Var2._M_p) {
          if ((0xfffffffeffffffff < uVar5 - 0x80000000) && (*piVar13 != 0x22)) {
            if (*piVar13 == 0) {
              *piVar13 = iVar1;
            }
            dither_mode = (int)uVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
              uVar5 = (ulong)(uint)dither_mode;
            }
LAB_00108ca5:
            bVar15 = (uint)uVar5 < 4;
LAB_00108ca8:
            if (!bVar15) goto switchD_00108891_caseD_68;
            break;
          }
          goto LAB_00109693;
        }
        goto LAB_0010969f;
      case 0x65:
        output_envelope = true;
        break;
      case 0x66:
        local_54 = (uint)CONCAT71((int7)((ulong)((long)&switchD_00108891::switchdataD_001111e0 +
                                                (long)(int)(&switchD_00108891::switchdataD_001111e0)
                                                           [uVar3]) >> 8),1);
        break;
      case 0x67:
        local_78._M_dataplus._M_p = (pointer)paVar14;
        sVar6 = strlen(pcVar12 + 2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar12 + 2,pcVar12 + sVar6 + 2);
        _Var2._M_p = local_78._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar1 = *piVar13;
        *piVar13 = 0;
        dVar17 = strtod(_Var2._M_p,&local_80);
        if (local_80 != _Var2._M_p) {
          if (*piVar13 == 0) {
            *piVar13 = iVar1;
            dVar16 = shifter_weight;
          }
          else {
            dVar16 = shifter_weight;
            if (*piVar13 == 0x22) goto LAB_001096cf;
          }
          goto LAB_00108dfa;
        }
        goto LAB_00109687;
      case 0x68:
        goto switchD_00108891_caseD_68;
      case 0x69:
        local_78._M_dataplus._M_p = (pointer)paVar14;
        sVar6 = strlen(pcVar12 + 2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar12 + 2,pcVar12 + sVar6 + 2);
        _Var2._M_p = local_78._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar1 = *piVar13;
        *piVar13 = 0;
        uVar5 = strtol(_Var2._M_p,&local_80,10);
        if (local_80 != _Var2._M_p) {
          if ((0xfffffffeffffffff < uVar5 - 0x80000000) && (*piVar13 != 0x22)) {
            if (*piVar13 == 0) {
              *piVar13 = iVar1;
            }
            force_initial_volume = (int)uVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
              uVar5 = (ulong)(uint)force_initial_volume;
            }
            goto LAB_00108d62;
          }
          goto LAB_0010966f;
        }
        goto LAB_0010967b;
      default:
        goto switchD_00108891_caseD_6a;
      case 0x6c:
        use_linearity_correction = false;
        break;
      case 0x6e:
        no_resampling = true;
        break;
      case 0x6f:
        output_encoded_wav = true;
        break;
      case 0x70:
        output_preprocessed = true;
        break;
      case 0x72:
        local_78._M_dataplus._M_p = (pointer)paVar14;
        sVar6 = strlen(pcVar12 + 2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar12 + 2,pcVar12 + sVar6 + 2);
        _Var2._M_p = local_78._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar1 = *piVar13;
        *piVar13 = 0;
        uVar5 = strtol(_Var2._M_p,&local_80,10);
        if (local_80 != _Var2._M_p) {
          if ((0xfffffffeffffffff < uVar5 - 0x80000000) && (*piVar13 != 0x22)) {
            if (*piVar13 == 0) {
              *piVar13 = iVar1;
            }
            sample_rate_ind = (int)uVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
              uVar5 = (ulong)(uint)sample_rate_ind;
            }
            bVar15 = (uint)uVar5 < 0x10;
            goto LAB_00108ca8;
          }
          goto LAB_00109657;
        }
        goto LAB_00109663;
      case 0x73:
        local_78._M_dataplus._M_p = (pointer)paVar14;
        sVar6 = strlen(pcVar12 + 2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar12 + 2,pcVar12 + sVar6 + 2);
        _Var2._M_p = local_78._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar1 = *piVar13;
        *piVar13 = 0;
        uVar5 = strtol(_Var2._M_p,&local_80,10);
        if (local_80 != _Var2._M_p) {
          if ((0xfffffffeffffffff < uVar5 - 0x80000000) && (*piVar13 != 0x22)) {
            if (*piVar13 == 0) {
              *piVar13 = iVar1;
            }
            noise_shape_mode = (int)uVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
              uVar5 = (ulong)(uint)noise_shape_mode;
            }
            goto LAB_00108ca5;
          }
LAB_0010963f:
          std::__throw_out_of_range("stoi");
        }
        std::__throw_invalid_argument("stoi");
LAB_00109657:
        std::__throw_out_of_range("stoi");
LAB_00109663:
        std::__throw_invalid_argument("stoi");
LAB_0010966f:
        std::__throw_out_of_range("stoi");
LAB_0010967b:
        std::__throw_invalid_argument("stoi");
LAB_00109687:
        std::__throw_invalid_argument("stod");
LAB_00109693:
        std::__throw_out_of_range("stoi");
LAB_0010969f:
        std::__throw_invalid_argument("stoi");
LAB_001096ab:
        std::__throw_out_of_range("stoi");
LAB_001096b7:
        std::__throw_invalid_argument("stoi");
LAB_001096c3:
        std::__throw_out_of_range("stod");
LAB_001096cf:
        uVar9 = std::__throw_out_of_range("stod");
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear(&local_50);
        _Unwind_Resume(uVar9);
      case 0x77:
        local_78._M_dataplus._M_p = (pointer)paVar14;
        sVar6 = strlen(pcVar12 + 2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar12 + 2,pcVar12 + sVar6 + 2);
        _Var2._M_p = local_78._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar1 = *piVar13;
        *piVar13 = 0;
        dVar16 = strtod(_Var2._M_p,&local_80);
        if (local_80 == _Var2._M_p) {
          std::__throw_invalid_argument("stod");
          goto LAB_0010963f;
        }
        if (*piVar13 == 0) {
          *piVar13 = iVar1;
          dVar17 = wave_gain;
LAB_00108dfa:
          shifter_weight = dVar16;
          wave_gain = dVar17;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          break;
        }
        dVar17 = wave_gain;
        if (*piVar13 != 0x22) goto LAB_00108dfa;
        goto LAB_001096c3;
      }
LAB_00108e67:
      paVar14 = &local_78.field_2;
      uVar11 = uVar11 + 1;
    } while (local_38 != uVar11);
    if ((help_mode == false) && (local_50._M_impl._M_node._M_size != 0)) {
      if ((local_54 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"gain: ",6);
        *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) | 0x400;
        poVar7 = std::ostream::_M_insert<double>(wave_gain);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (force_initial_volume < 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"initial volume: auto",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"center bias level: ",0x13);
        plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,center_bias_level);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"slope weight: ",0xe);
        *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) | 0x400;
        poVar7 = std::ostream::_M_insert<double>(shifter_weight);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        uVar11 = (ulong)(uint)dither_mode;
        if (uVar11 < 4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,&DAT_001112c0 + *(int *)(&DAT_001112c0 + uVar11 * 4),
                     *(long *)(&DAT_00111a90 + uVar11 * 8));
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
        }
        uVar11 = (ulong)(uint)noise_shape_mode;
        if (uVar11 < 4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,&DAT_001112d0 + *(int *)(&DAT_001112d0 + uVar11 * 4),
                     *(long *)(&DAT_00111ab0 + uVar11 * 8));
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
        }
        pcVar12 = "linearity correction: off";
        if ((ulong)use_linearity_correction != 0) {
          pcVar12 = "linearity correction: on";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar12,(ulong)use_linearity_correction ^ 0x19);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        if (local_50._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_50)
        {
          p_Var10 = local_50._M_impl._M_node.super__List_node_base._M_next;
          do {
            local_78._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,p_Var10[1]._M_next,
                       (long)&(p_Var10[1]._M_prev)->_M_next + (long)p_Var10[1]._M_next);
            processInputFile(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar14) {
              operator_delete(local_78._M_dataplus._M_p);
            }
            p_Var10 = (((_List_impl *)&p_Var10->_M_next)->_M_node).super__List_node_base._M_next;
          } while (p_Var10 != (_List_node_base *)&local_50);
        }
      }
      else {
        if (force_initial_volume < 0) {
          force_initial_volume = 0x40;
        }
        if (local_50._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_50)
        {
          p_Var10 = local_50._M_impl._M_node.super__List_node_base._M_next;
          do {
            local_78._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,p_Var10[1]._M_next,
                       (long)&(p_Var10[1]._M_prev)->_M_next + (long)p_Var10[1]._M_next);
            processDmcInputFile(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != paVar14) {
              operator_delete(local_78._M_dataplus._M_p);
            }
            p_Var10 = (((_List_impl *)&p_Var10->_M_next)->_M_node).super__List_node_base._M_next;
          } while (p_Var10 != (_List_node_base *)&local_50);
        }
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&local_50);
      return 0;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Usage: dpcmc [options] <input> ..",0x21);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<input> supports uncompressed WAV, AIFF/AIFC, SND (AU), MAT-file (Matlab)",0x49);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Options:",8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -g[gain]   Input volume(default:gain=1.0)",0x2b);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -i[0..127] Initial volume(default:auto)",0x29);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -c[0..127] Center bias level(default:64)",0x2a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -w[weight] Slope weight(default:weight=1.0)",0x2d);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -r[rate]   Output sampling rate(default:15) rate:",0x33);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  piVar13 = sample_rate_cycles;
  uVar11 = 0;
  do {
    if ((uVar11 & 3) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"                 ",0x11);
    }
    if (uVar11 < 10) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    }
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)uVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) | 0x400;
    poVar7 = std::ostream::_M_insert<double>(1789772.5 / (double)*piVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Hz ",3);
    if (((uint)uVar11 & 3) == 3) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    uVar11 = uVar11 + 1;
    piVar13 = piVar13 + 1;
  } while (uVar11 != 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -n         No resampling",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -d[mode]   Dither mode:",0x19);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 0 : off",0x18);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 1 : Rectangle",0x1e);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 2 : Triangle",0x1d);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 3 : Highpassed Triangle(default)",0x31);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -s[mode]   Noise shaping mode:",0x20);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 0 : off",0x18);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 1 : Lowpass",0x1c);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 2 : Highpass",0x1d);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 3 : equal-loudness(default)",0x2c);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -l         Disable correction of linearity(default:enable)",
             0x3c);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -e         Output envelope to wav file(default:off)",0x35);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "  -p         Output preprocessed waveform to wav file(default:off)",0x42);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "  -o         Output waveform after encode to wav file(default:off)",0x42);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -f         Convert dmc to wav file",0x24);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  -h         Show this help",0x1b);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  exit(0);
}

Assistant:

int main(int argc, char * argv[])
{
	std::list<std::string> in_file_list;

	bool dmc2wav_mode = false;
	
	// コマンドラインオプションを処理する
	for (int i=1; i<argc; ++i) {
		if (argv[i][0] == '-') {
			switch (argv[i][1]) {
				case 'g':
					wave_gain = std::stod(&argv[i][2]);
					break;
					
				case 'i':
					force_initial_volume = std::stoi(&argv[i][2]);
					if (force_initial_volume > 127) help_mode = true;
					if (force_initial_volume < 0) help_mode = true;
					break;
					
				case 'c':
					center_bias_level = std::stoi(&argv[i][2]);
					if (center_bias_level > 127) help_mode = true;
					if (center_bias_level < 0) help_mode = true;
					break;

				case 'w':
					shifter_weight = std::stod(&argv[i][2]);
					break;
					
				case 'r':
					sample_rate_ind = std::stoi(&argv[i][2]);
					if (sample_rate_ind > 15 || sample_rate_ind < 0) {
						help_mode = true;
					}
					break;
					
				case 'n':
					no_resampling = true;
					break;
					
				case 'd':
					dither_mode = std::stoi(&argv[i][2]);
					if (dither_mode < 0 || dither_mode > 3) {
						help_mode = true;
					}
					break;
					
				case 's':
					noise_shape_mode = std::stoi(&argv[i][2]);
					if (noise_shape_mode < 0 || noise_shape_mode > 3) {
						help_mode = true;
					}
					break;

				case 'l':
					use_linearity_correction = false;
					break;
					
				case 'e':
					output_envelope = true;
					break;
					
				case 'p':
					output_preprocessed = true;
					break;

				case 'o':
					output_encoded_wav = true;
					break;

				case 'h':
					help_mode = true;
					break;
					
				case 'f':
					dmc2wav_mode = true;
					break;
					
				default:
					std::cout << "Invalid option: " << argv[i] << std::endl;
					help_mode = true;
					break;
			}
		}
		else {
			std::string path(argv[i]);
			in_file_list.push_back(path);
		}
	}
	
	if (help_mode || (in_file_list.size() == 0)) {
		std::cout << "Usage: dpcmc [options] <input> .." << std::endl;
		std::cout << "<input> supports uncompressed WAV, AIFF/AIFC, SND (AU), MAT-file (Matlab)" << std::endl;
		std::cout << "Options:" << std::endl;
		std::cout << "  -g[gain]   Input volume(default:gain=1.0)" << std::endl;
		std::cout << "  -i[0..127] Initial volume(default:auto)" << std::endl;
		std::cout << "  -c[0..127] Center bias level(default:64)" << std::endl;
		std::cout << "  -w[weight] Slope weight(default:weight=1.0)" << std::endl;
		std::cout << "  -r[rate]   Output sampling rate(default:15) rate:" << std::endl;
		for (int i=0; i<16; ++i) {
			if ((i % 4) == 0) {
				std::cout << "                 ";
			}
			if (i < 10) {
				std::cout << " ";
			}
			std::cout << i << ":" << std::showpoint << dpcmSampleRateValue(i) << "Hz ";
			if ((i % 4) == 3) {
				std::cout << std::endl;
			}
		}
		std::cout << "  -n         No resampling" << std::endl;
		std::cout << "  -d[mode]   Dither mode:" << std::endl;
		std::cout << "                 0 : off" << std::endl;
		std::cout << "                 1 : Rectangle" << std::endl;
		std::cout << "                 2 : Triangle" << std::endl;
		std::cout << "                 3 : Highpassed Triangle(default)" << std::endl;
		std::cout << "  -s[mode]   Noise shaping mode:" << std::endl;
		std::cout << "                 0 : off" << std::endl;
		std::cout << "                 1 : Lowpass" << std::endl;
		std::cout << "                 2 : Highpass" << std::endl;
		std::cout << "                 3 : equal-loudness(default)" << std::endl;
		std::cout << "  -l         Disable correction of linearity(default:enable)" << std::endl;
		std::cout << "  -e         Output envelope to wav file(default:off)" << std::endl;
		std::cout << "  -p         Output preprocessed waveform to wav file(default:off)" << std::endl;
		std::cout << "  -o         Output waveform after encode to wav file(default:off)" << std::endl;
		std::cout << "  -f         Convert dmc to wav file" << std::endl;
		std::cout << "  -h         Show this help" << std::endl;
		exit(0);
	}
	
	if (dmc2wav_mode) {
		if (force_initial_volume < 0) {
			force_initial_volume = 64;
		}
		
		std::for_each(in_file_list.cbegin(), in_file_list.cend(), [](std::string in_file_path) {
			processDmcInputFile(in_file_path);
		});
	}
	else {
		std::cout << "gain: " << std::showpoint << wave_gain << std::endl;
		if (force_initial_volume < 0) {
			std::cout << "initial volume: auto" << std::endl;
		}
		std::cout << "center bias level: " << center_bias_level << std::endl;
		std::cout << "slope weight: " << std::showpoint << shifter_weight << std::endl;
		switch (dither_mode) {
			case 0:
				std::cout << "dither: off" << std::endl;
				break;
			case 1:
				std::cout << "dither: Rectangle" << std::endl;
				break;
			case 2:
				std::cout << "dither: Triangle" << std::endl;
				break;
			case 3:
				std::cout << "dither: Highpass Triangle" << std::endl;
				break;
			default:
				break;
		}
		switch (noise_shape_mode) {
			case 0:
				std::cout << "noise shape: off" << std::endl;
				break;
			case 1:
				std::cout << "noise shape: Lowpass" << std::endl;
				break;
			case 2:
				std::cout << "noise shape: Highpass" << std::endl;
				break;
			case 3:
				std::cout << "noise shape: equal-loudness" << std::endl;
				break;
			default:
				break;
		}
		if (use_linearity_correction) {
			std::cout << "linearity correction: on" << std::endl;
		}
		else {
			std::cout << "linearity correction: off" << std::endl;
		}

		std::for_each(in_file_list.cbegin(), in_file_list.cend(), [](std::string in_file_path) {
			processInputFile(in_file_path);
		});
	}
	
	return 0;
}